

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2Dgridsearch.cpp
# Opt level: O0

uchar getCostT<2>(uchar **Grid2D,int x,int y,int param_4)

{
  int iVar1;
  int iVar2;
  uchar local_21;
  int dx;
  int dy;
  uchar maximum;
  int param_3_local;
  int y_local;
  int x_local;
  uchar **Grid2D_local;
  
  iVar1 = x * 2;
  iVar2 = y * 2;
  maximum = Grid2D[iVar1][iVar2];
  for (dy = 0; dy < 2; dy = dy + 1) {
    for (dx = 0; dx < 2; dx = dx + 1) {
      if (Grid2D[iVar1 + dx][iVar2 + dy] < maximum) {
        local_21 = maximum;
      }
      else {
        local_21 = Grid2D[iVar1 + dx][iVar2 + dy];
      }
      maximum = local_21;
    }
  }
  return maximum;
}

Assistant:

unsigned char getCostT(unsigned char **Grid2D, int x, int y, int /*resample*/)
{
    if(N == 1) // the compiler will optimize out this if statement
    {
        return Grid2D[x][y];
    }
    else
    {
        x *= N;
        y *= N;
        unsigned char maximum = Grid2D[x][y];
        for(int dy=0; dy<N; dy++)
            for(int dx=0; dx<N; dx++)
                maximum = __max(maximum, Grid2D[x+dx][y+dy]);

        return maximum;
    }
}